

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

int __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::clone
          (wrapexcept<boost::xpressive::regex_error> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  exception *b;
  deleter del;
  wrapexcept<boost::xpressive::regex_error> *p;
  wrapexcept<boost::xpressive::regex_error> *in_stack_ffffffffffffffb8;
  wrapexcept<boost::xpressive::regex_error> *in_stack_ffffffffffffffc0;
  exception *in_stack_ffffffffffffffe0;
  
  b = (exception *)operator_new(0x48);
  wrapexcept(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  exception_detail::copy_boost_exception(in_stack_ffffffffffffffe0,b);
  deleter::~deleter((deleter *)b);
  return (int)b;
}

Assistant:

virtual boost::exception_detail::clone_base const * clone() const BOOST_OVERRIDE
    {
        wrapexcept * p = new wrapexcept( *this );
        deleter del = { p };

        boost::exception_detail::copy_boost_exception( p, this );

        del.p_ = BOOST_NULLPTR;
        return p;
    }